

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall polyscope::SurfaceMesh::buildEdgeInfoGui(SurfaceMesh *this,size_t eInd)

{
  pointer puVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  ulong uVar8;
  float fVar9;
  string __str;
  long *local_68;
  long local_58;
  long lStack_50;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  puVar1 = (this->edgePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->edgePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    eInd = puVar1[eInd];
  }
  cVar4 = '\x01';
  if (9 < eInd) {
    uVar8 = eInd;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_002465d9;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_002465d9;
      }
      if (uVar8 < 10000) goto LAB_002465d9;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_002465d9:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_48,local_40,eInd);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x34c5a4);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar5[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ImGui::TextUnformatted((char *)local_68,(char *)0x0);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.0);
  ImGui::Columns(2,(char *)0x0,true);
  fVar9 = ImGui::GetWindowWidth();
  ImGui::SetColumnWidth(0,fVar9 / 3.0);
  for (p_Var6 = *(_Rb_tree_node_base **)
                 &(this->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.
                  field_0x3d8;
      p_Var6 != (_Rb_tree_node_base *)
                &(this->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.field_0x3c8
      ; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    (**(code **)(**(long **)(p_Var6 + 2) + 0x60))();
  }
  ImGui::Indent(-20.0);
  ImGui::Columns(1,(char *)0x0,true);
  return;
}

Assistant:

void SurfaceMesh::buildEdgeInfoGui(size_t eInd) {
  size_t displayInd = eInd;
  if (edgePerm.size() > 0) {
    displayInd = edgePerm[eInd];
  }
  ImGui::TextUnformatted(("Edge #" + std::to_string(displayInd)).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildEdgeInfoGUI(eInd);
  }

  ImGui::Indent(-20.);
  ImGui::Columns(1);
}